

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

int __thiscall Fl_Text_Display::find_x(Fl_Text_Display *this,char *s,int len,int style,int x)

{
  int iVar1;
  int iVar2;
  double dVar3;
  
  iVar1 = 0;
  do {
    iVar2 = iVar1;
    if (len <= iVar2) {
      return len;
    }
    iVar1 = fl_utf8len1(s[iVar2]);
    dVar3 = string_width(this,s,iVar1 + iVar2,style);
    iVar1 = iVar1 + iVar2;
  } while ((int)dVar3 <= x);
  return iVar2;
}

Assistant:

int Fl_Text_Display::find_x(const char *s, int len, int style, int x) const {
  IS_UTF8_ALIGNED(s)

  // TODO: use binary search which may be quicker.
  int i = 0;
  while (i<len) {
    int cl = fl_utf8len1(s[i]);
    int w = int( string_width(s, i+cl, style) );
    if (w>x)
      return i;
    i += cl;
  }
  return len;
}